

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O0

void __thiscall
QSharedDataPointer<QFileInfoPrivate>::detach_helper(QSharedDataPointer<QFileInfoPrivate> *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  QFileInfoPrivate *pQVar3;
  int in_ECX;
  void *in_RDX;
  __fn *in_RSI;
  QSharedDataPointer<QFileInfoPrivate> *in_RDI;
  void *in_R8;
  QFileInfoPrivate *x;
  QBasicAtomicInteger<int> *in_stack_ffffffffffffffe0;
  
  iVar2 = clone(in_RDI,in_RSI,in_RDX,in_ECX,in_R8);
  QBasicAtomicInteger<int>::ref(in_stack_ffffffffffffffe0);
  Qt::totally_ordered_wrapper<QFileInfoPrivate_*>::get(&in_RDI->d);
  bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x29ff3d);
  if ((!bVar1) &&
     (pQVar3 = Qt::totally_ordered_wrapper<QFileInfoPrivate_*>::get(&in_RDI->d),
     pQVar3 != (QFileInfoPrivate *)0x0)) {
    QFileInfoPrivate::~QFileInfoPrivate((QFileInfoPrivate *)this);
    operator_delete(pQVar3,0x1e8);
  }
  Qt::totally_ordered_wrapper<QFileInfoPrivate_*>::reset
            (&in_RDI->d,(QFileInfoPrivate *)CONCAT44(extraout_var,iVar2));
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QSharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d.get()->ref.deref())
        delete d.get();
    d.reset(x);
}